

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O1

void sorter_sqrt_sort_merge_right(int64_t *arr,int L1,int L2,int M)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int64_t *piVar4;
  uint uVar5;
  long *plVar6;
  
  iVar1 = L2 + L1 + -1;
  iVar3 = M + L2 + L1 + -1;
  if (0 < L1) {
    uVar5 = L1 - 1;
    plVar6 = arr + iVar3;
    do {
      if ((iVar1 < L1) || (lVar2 = arr[iVar1], lVar2 < arr[uVar5])) {
        lVar2 = arr[uVar5];
        uVar5 = uVar5 - 1;
      }
      else {
        iVar1 = iVar1 + -1;
      }
      *plVar6 = lVar2;
      plVar6 = plVar6 + -1;
      iVar3 = iVar3 + -1;
    } while (-1 < (int)uVar5);
  }
  if (L1 <= iVar1 && iVar1 != iVar3) {
    piVar4 = arr + iVar3;
    lVar2 = (long)iVar1 + 1;
    do {
      *piVar4 = arr[lVar2 + -1];
      piVar4 = piVar4 + -1;
      lVar2 = lVar2 + -1;
    } while (L1 < lVar2);
  }
  return;
}

Assistant:

static void SQRT_SORT_MERGE_RIGHT(SORT_TYPE *arr, int L1, int L2, int M) {
  int p0 = L1 + L2 + M - 1, p2 = L1 + L2 - 1, p1 = L1 - 1;

  while (p1 >= 0) {
    if (p2 < L1 || SORT_CMP_A(arr + p1, arr + p2) > 0) {
      arr[p0--] = arr[p1--];
    } else {
      arr[p0--] = arr[p2--];
    }
  }

  if (p2 != p0)
    while (p2 >= L1) {
      arr[p0--] = arr[p2--];
    }
}